

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

int CInput::CJoystick::GetJoystickHatKey(int Hat,int HatValue)

{
  int HatValue_local;
  int Hat_local;
  int local_4;
  
  switch(HatValue) {
  case 1:
    local_4 = Hat * 8 + 0x1b3;
    break;
  case 2:
    local_4 = Hat * 8 + 0x1b6;
    break;
  case 3:
    local_4 = Hat * 8 + 0x1b4;
    break;
  case 4:
    local_4 = Hat * 8 + 0x1b8;
    break;
  default:
    local_4 = -1;
    break;
  case 6:
    local_4 = Hat * 8 + 0x1b9;
    break;
  case 8:
    local_4 = Hat * 8 + 0x1b5;
    break;
  case 9:
    local_4 = Hat * 8 + 0x1b2;
    break;
  case 0xc:
    local_4 = Hat * 8 + 0x1b7;
  }
  return local_4;
}

Assistant:

int CInput::CJoystick::GetJoystickHatKey(int Hat, int HatValue)
{
	switch(HatValue)
	{
		case SDL_HAT_LEFTUP: return KEY_JOY_HAT0_LEFTUP + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_UP: return KEY_JOY_HAT0_UP + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_RIGHTUP: return KEY_JOY_HAT0_RIGHTUP + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_LEFT: return KEY_JOY_HAT0_LEFT + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_RIGHT: return KEY_JOY_HAT0_RIGHT + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_LEFTDOWN: return KEY_JOY_HAT0_LEFTDOWN + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_DOWN: return KEY_JOY_HAT0_DOWN + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
		case SDL_HAT_RIGHTDOWN: return KEY_JOY_HAT0_RIGHTDOWN + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT;
	}
	return -1;
}